

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::RmsPropTrainer::update(RmsPropTrainer *this,real scale)

{
  pointer ppLVar1;
  long lVar2;
  Parameters *this_00;
  pointer pfVar3;
  float *pfVar4;
  float *pfVar5;
  pointer pTVar6;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar13;
  byte bVar14;
  int iVar15;
  undefined4 extraout_var;
  float *pfVar16;
  Model *pMVar17;
  Index size;
  ulong uVar18;
  pointer ppPVar19;
  pointer ppLVar20;
  uint uVar21;
  pointer pTVar22;
  uint uVar23;
  Index index_1;
  ulong uVar24;
  ulong uVar25;
  LookupParameters *this_01;
  ulong uVar26;
  ulong uVar27;
  RmsPropTrainer *pRVar28;
  uint uVar29;
  _Hash_node_base *p_Var30;
  uint uVar31;
  ushort uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  int iVar53;
  Scalar SVar54;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  real rVar63;
  undefined4 uVar64;
  scalar_sum_op<float,_float> local_c9;
  RmsPropTrainer *local_c8;
  LookupParameters *local_c0;
  ulong local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  float local_98 [2];
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  variable_if_dynamic<long,__1> local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float *local_50;
  ulong local_48;
  
  local_b0 = (pointer)CONCAT44(local_b0._4_4_,scale);
  local_c8 = this;
  if (this->shadow_params_allocated == false) {
    pMVar17 = (this->super_Trainer).model;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->hg,
               (long)(pMVar17->params).
                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pMVar17->params).
                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    pMVar17 = (this->super_Trainer).model;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->hlg,
             (long)(pMVar17->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar17->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
    pMVar17 = (this->super_Trainer).model;
    ppLVar20 = (pMVar17->lookup_params).
               super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppLVar1 = (pMVar17->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppLVar20 != ppLVar1) {
      uVar25 = 0;
      do {
        lVar2 = *(long *)&this->hlg;
        iVar15 = (*((*ppLVar20)->super_ParametersBase)._vptr_ParametersBase[3])();
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)(uVar25 * 0x18 + lVar2),
                   CONCAT44(extraout_var,iVar15));
        ppLVar20 = ppLVar20 + 1;
        uVar25 = (ulong)((int)uVar25 + 1);
      } while (ppLVar20 != ppLVar1);
    }
    local_c8->shadow_params_allocated = true;
  }
  local_a8._0_4_ = Trainer::clip_gradients(&local_c8->super_Trainer);
  pMVar17 = (local_c8->super_Trainer).model;
  local_a0 = (pMVar17->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppPVar19 = (pMVar17->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppPVar19 != local_a0) {
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    local_c0 = (LookupParameters *)0x0;
    local_b8 = CONCAT44(local_b8._4_4_,local_a8._0_4_ * local_b0._0_4_);
    do {
      this_00 = *ppPVar19;
      local_68._0_8_ = ppPVar19;
      iVar15 = 1;
      iVar53 = 1;
      uVar25 = (ulong)(this_00->values).d.nd;
      if (uVar25 != 0) {
        auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar38 = vpbroadcastq_avx512f();
        uVar18 = 0;
        do {
          auVar39 = vpbroadcastq_avx512f();
          auVar40 = vmovdqa64_avx512f(auVar37);
          auVar37 = vporq_avx512f(auVar39,auVar35);
          auVar39 = vporq_avx512f(auVar39,auVar36);
          uVar10 = vpcmpuq_avx512f(auVar39,auVar38,2);
          bVar13 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar37,auVar38,2);
          bVar14 = (byte)uVar10;
          uVar32 = CONCAT11(bVar14,bVar13);
          auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar18));
          auVar39._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar37._4_4_;
          auVar39._0_4_ = (uint)(bVar13 & 1) * auVar37._0_4_;
          auVar39._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar37._8_4_;
          auVar39._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar37._12_4_;
          auVar39._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar37._16_4_;
          auVar39._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar37._20_4_;
          auVar39._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar37._24_4_;
          auVar39._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar37._28_4_;
          auVar39._32_4_ = (uint)(bVar14 & 1) * auVar37._32_4_;
          auVar39._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar37._36_4_;
          auVar39._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar37._40_4_;
          auVar39._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar37._44_4_;
          auVar39._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar37._48_4_;
          auVar39._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar37._52_4_;
          auVar39._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar37._56_4_;
          auVar39._60_4_ = (uint)(bVar14 >> 7) * auVar37._60_4_;
          uVar18 = uVar18 + 0x10;
          auVar37 = vpmulld_avx512f(auVar39,auVar40);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar18);
        auVar37 = vmovdqa32_avx512f(auVar37);
        auVar38._0_4_ =
             (uint)(bVar13 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar40._0_4_;
        bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * auVar40._4_4_;
        bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar7 * auVar37._8_4_ | (uint)!bVar7 * auVar40._8_4_;
        bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar7 * auVar37._12_4_ | (uint)!bVar7 * auVar40._12_4_;
        bVar7 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar7 * auVar37._16_4_ | (uint)!bVar7 * auVar40._16_4_;
        bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar7 * auVar37._20_4_ | (uint)!bVar7 * auVar40._20_4_;
        bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar7 * auVar37._24_4_ | (uint)!bVar7 * auVar40._24_4_;
        bVar7 = (bool)((byte)(uVar32 >> 7) & 1);
        auVar38._28_4_ = (uint)bVar7 * auVar37._28_4_ | (uint)!bVar7 * auVar40._28_4_;
        auVar38._32_4_ =
             (uint)(bVar14 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar40._32_4_;
        bVar7 = (bool)(bVar14 >> 1 & 1);
        auVar38._36_4_ = (uint)bVar7 * auVar37._36_4_ | (uint)!bVar7 * auVar40._36_4_;
        bVar7 = (bool)(bVar14 >> 2 & 1);
        auVar38._40_4_ = (uint)bVar7 * auVar37._40_4_ | (uint)!bVar7 * auVar40._40_4_;
        bVar7 = (bool)(bVar14 >> 3 & 1);
        auVar38._44_4_ = (uint)bVar7 * auVar37._44_4_ | (uint)!bVar7 * auVar40._44_4_;
        bVar7 = (bool)(bVar14 >> 4 & 1);
        auVar38._48_4_ = (uint)bVar7 * auVar37._48_4_ | (uint)!bVar7 * auVar40._48_4_;
        bVar7 = (bool)(bVar14 >> 5 & 1);
        auVar38._52_4_ = (uint)bVar7 * auVar37._52_4_ | (uint)!bVar7 * auVar40._52_4_;
        bVar7 = (bool)(bVar14 >> 6 & 1);
        auVar38._56_4_ = (uint)bVar7 * auVar37._56_4_ | (uint)!bVar7 * auVar40._56_4_;
        auVar38._60_4_ =
             (uint)(bVar14 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar40._60_4_;
        auVar34 = vextracti64x4_avx512f(auVar38,1);
        auVar37 = vpmulld_avx512f(auVar38,ZEXT3264(auVar34));
        auVar55 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar33 = vpshufd_avx(auVar55,0xee);
        auVar55 = vpmulld_avx(auVar55,auVar33);
        auVar33 = vpshufd_avx(auVar55,0x55);
        auVar55 = vpmulld_avx(auVar55,auVar33);
        iVar53 = auVar55._0_4_;
      }
      uVar25 = (ulong)(this_00->g).d.nd;
      if (uVar25 != 0) {
        auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar38 = vpbroadcastq_avx512f();
        uVar18 = 0;
        do {
          auVar39 = vpbroadcastq_avx512f();
          auVar40 = vmovdqa64_avx512f(auVar37);
          auVar37 = vporq_avx512f(auVar39,auVar35);
          auVar39 = vporq_avx512f(auVar39,auVar36);
          uVar10 = vpcmpuq_avx512f(auVar39,auVar38,2);
          bVar13 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar37,auVar38,2);
          bVar14 = (byte)uVar10;
          uVar32 = CONCAT11(bVar14,bVar13);
          auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar18));
          auVar45._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar37._4_4_;
          auVar45._0_4_ = (uint)(bVar13 & 1) * auVar37._0_4_;
          auVar45._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar37._8_4_;
          auVar45._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar37._12_4_;
          auVar45._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar37._16_4_;
          auVar45._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar37._20_4_;
          auVar45._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar37._24_4_;
          auVar45._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar37._28_4_;
          auVar45._32_4_ = (uint)(bVar14 & 1) * auVar37._32_4_;
          auVar45._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar37._36_4_;
          auVar45._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar37._40_4_;
          auVar45._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar37._44_4_;
          auVar45._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar37._48_4_;
          auVar45._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar37._52_4_;
          auVar45._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar37._56_4_;
          auVar45._60_4_ = (uint)(bVar14 >> 7) * auVar37._60_4_;
          uVar18 = uVar18 + 0x10;
          auVar37 = vpmulld_avx512f(auVar45,auVar40);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar18);
        auVar37 = vmovdqa32_avx512f(auVar37);
        auVar41._0_4_ =
             (uint)(bVar13 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar40._0_4_;
        bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * auVar40._4_4_;
        bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar7 * auVar37._8_4_ | (uint)!bVar7 * auVar40._8_4_;
        bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar7 * auVar37._12_4_ | (uint)!bVar7 * auVar40._12_4_;
        bVar7 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar7 * auVar37._16_4_ | (uint)!bVar7 * auVar40._16_4_;
        bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar7 * auVar37._20_4_ | (uint)!bVar7 * auVar40._20_4_;
        bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar7 * auVar37._24_4_ | (uint)!bVar7 * auVar40._24_4_;
        bVar7 = (bool)((byte)(uVar32 >> 7) & 1);
        auVar41._28_4_ = (uint)bVar7 * auVar37._28_4_ | (uint)!bVar7 * auVar40._28_4_;
        auVar41._32_4_ =
             (uint)(bVar14 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar40._32_4_;
        bVar7 = (bool)(bVar14 >> 1 & 1);
        auVar41._36_4_ = (uint)bVar7 * auVar37._36_4_ | (uint)!bVar7 * auVar40._36_4_;
        bVar7 = (bool)(bVar14 >> 2 & 1);
        auVar41._40_4_ = (uint)bVar7 * auVar37._40_4_ | (uint)!bVar7 * auVar40._40_4_;
        bVar7 = (bool)(bVar14 >> 3 & 1);
        auVar41._44_4_ = (uint)bVar7 * auVar37._44_4_ | (uint)!bVar7 * auVar40._44_4_;
        bVar7 = (bool)(bVar14 >> 4 & 1);
        auVar41._48_4_ = (uint)bVar7 * auVar37._48_4_ | (uint)!bVar7 * auVar40._48_4_;
        bVar7 = (bool)(bVar14 >> 5 & 1);
        auVar41._52_4_ = (uint)bVar7 * auVar37._52_4_ | (uint)!bVar7 * auVar40._52_4_;
        bVar7 = (bool)(bVar14 >> 6 & 1);
        auVar41._56_4_ = (uint)bVar7 * auVar37._56_4_ | (uint)!bVar7 * auVar40._56_4_;
        auVar41._60_4_ =
             (uint)(bVar14 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar40._60_4_;
        auVar34 = vextracti64x4_avx512f(auVar41,1);
        auVar37 = vpmulld_avx512f(auVar41,ZEXT3264(auVar34));
        auVar55 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar33 = vpshufd_avx(auVar55,0xee);
        auVar55 = vpmulld_avx(auVar55,auVar33);
        auVar33 = vpshufd_avx(auVar55,0x55);
        auVar55 = vpmulld_avx(auVar55,auVar33);
        iVar15 = auVar55._0_4_;
      }
      rVar63 = (local_c8->super_Trainer).lambda;
      auVar55 = ZEXT416((uint)rVar63);
      uVar29 = iVar53 * (this_00->values).d.bd;
      uVar21 = iVar15 * (this_00->g).d.bd;
      local_48 = (ulong)uVar21;
      pfVar3 = (local_c8->hg).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4 = (this_00->values).v;
      pfVar16 = (this_00->g).v;
      local_50 = pfVar16;
      if (uVar21 == 0) {
        auVar33 = ZEXT816(0) << 0x40;
      }
      else {
        local_90 = SUB84(pfVar16,0);
        uStack_8c = (undefined4)((ulong)pfVar16 >> 0x20);
        local_78 = ZEXT416((uint)rVar63);
        local_80.m_value = local_48;
        SVar54 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)local_98,&local_c9,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                             *)&local_50);
        auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        pfVar16 = (this_00->g).v;
        uVar25 = (ulong)(this_00->g).d.nd;
        auVar33._0_8_ = (double)SVar54;
        auVar33._8_8_ = extraout_XMM0_Qb;
        auVar55 = local_78;
      }
      auVar60._0_8_ = (double)(local_c8->rho * pfVar3[(ulong)local_c0 & 0xffffffff]);
      auVar60._8_8_ = 0;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = 1.0 - (double)local_c8->rho;
      auVar33 = vfmadd213sd_fma(auVar57,auVar33,auVar60);
      pfVar3[(ulong)local_c0 & 0xffffffff] = (float)auVar33._0_8_;
      fVar8 = (float)auVar33._0_8_ + local_c8->epsilon;
      auVar33 = vrsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      auVar57 = vfmadd213ss_fma(ZEXT416((uint)(fVar8 * auVar33._0_4_)),auVar33,ZEXT416(0xc0400000));
      if ((int)uVar25 == 0) {
        iVar15 = 1;
      }
      else {
        auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar38 = vpbroadcastq_avx512f();
        uVar18 = 0;
        do {
          auVar39 = vpbroadcastq_avx512f();
          auVar40 = vmovdqa64_avx512f(auVar37);
          auVar37 = vporq_avx512f(auVar39,auVar35);
          auVar39 = vporq_avx512f(auVar39,auVar36);
          uVar10 = vpcmpuq_avx512f(auVar39,auVar38,2);
          bVar13 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar37,auVar38,2);
          bVar14 = (byte)uVar10;
          uVar32 = CONCAT11(bVar14,bVar13);
          auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar18));
          auVar42._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar37._4_4_;
          auVar42._0_4_ = (uint)(bVar13 & 1) * auVar37._0_4_;
          auVar42._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar37._8_4_;
          auVar42._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar37._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar37._16_4_;
          auVar42._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar37._20_4_;
          auVar42._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar37._24_4_;
          auVar42._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar37._28_4_;
          auVar42._32_4_ = (uint)(bVar14 & 1) * auVar37._32_4_;
          auVar42._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar37._36_4_;
          auVar42._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar37._40_4_;
          auVar42._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar37._44_4_;
          auVar42._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar37._48_4_;
          auVar42._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar37._52_4_;
          auVar42._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar37._56_4_;
          auVar42._60_4_ = (uint)(bVar14 >> 7) * auVar37._60_4_;
          uVar18 = uVar18 + 0x10;
          auVar37 = vpmulld_avx512f(auVar42,auVar40);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar18);
        auVar37 = vmovdqa32_avx512f(auVar37);
        auVar43._0_4_ =
             (uint)(bVar13 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar40._0_4_;
        bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar43._4_4_ = (uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * auVar40._4_4_;
        bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar43._8_4_ = (uint)bVar7 * auVar37._8_4_ | (uint)!bVar7 * auVar40._8_4_;
        bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar43._12_4_ = (uint)bVar7 * auVar37._12_4_ | (uint)!bVar7 * auVar40._12_4_;
        bVar7 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar43._16_4_ = (uint)bVar7 * auVar37._16_4_ | (uint)!bVar7 * auVar40._16_4_;
        bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar43._20_4_ = (uint)bVar7 * auVar37._20_4_ | (uint)!bVar7 * auVar40._20_4_;
        bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar43._24_4_ = (uint)bVar7 * auVar37._24_4_ | (uint)!bVar7 * auVar40._24_4_;
        bVar7 = (bool)((byte)(uVar32 >> 7) & 1);
        auVar43._28_4_ = (uint)bVar7 * auVar37._28_4_ | (uint)!bVar7 * auVar40._28_4_;
        auVar43._32_4_ =
             (uint)(bVar14 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar40._32_4_;
        bVar7 = (bool)(bVar14 >> 1 & 1);
        auVar43._36_4_ = (uint)bVar7 * auVar37._36_4_ | (uint)!bVar7 * auVar40._36_4_;
        bVar7 = (bool)(bVar14 >> 2 & 1);
        auVar43._40_4_ = (uint)bVar7 * auVar37._40_4_ | (uint)!bVar7 * auVar40._40_4_;
        bVar7 = (bool)(bVar14 >> 3 & 1);
        auVar43._44_4_ = (uint)bVar7 * auVar37._44_4_ | (uint)!bVar7 * auVar40._44_4_;
        bVar7 = (bool)(bVar14 >> 4 & 1);
        auVar43._48_4_ = (uint)bVar7 * auVar37._48_4_ | (uint)!bVar7 * auVar40._48_4_;
        bVar7 = (bool)(bVar14 >> 5 & 1);
        auVar43._52_4_ = (uint)bVar7 * auVar37._52_4_ | (uint)!bVar7 * auVar40._52_4_;
        bVar7 = (bool)(bVar14 >> 6 & 1);
        auVar43._56_4_ = (uint)bVar7 * auVar37._56_4_ | (uint)!bVar7 * auVar40._56_4_;
        auVar43._60_4_ =
             (uint)(bVar14 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar40._60_4_;
        auVar34 = vextracti64x4_avx512f(auVar43,1);
        auVar37 = vpmulld_avx512f(auVar43,ZEXT3264(auVar34));
        auVar60 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar9 = vpshufd_avx(auVar60,0xee);
        auVar60 = vpmulld_avx(auVar60,auVar9);
        auVar9 = vpshufd_avx(auVar60,0x55);
        auVar60 = vpmulld_avx(auVar60,auVar9);
        iVar15 = auVar60._0_4_;
      }
      if (iVar15 * (this_00->g).d.bd != uVar29) {
LAB_0022c0e8:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
                     );
      }
      uVar25 = (ulong)(this_00->values).d.nd;
      if (uVar25 == 0) {
        iVar15 = 1;
      }
      else {
        auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar38 = vpbroadcastq_avx512f();
        uVar18 = 0;
        do {
          auVar39 = vpbroadcastq_avx512f();
          auVar40 = vmovdqa64_avx512f(auVar37);
          auVar37 = vporq_avx512f(auVar39,auVar35);
          auVar39 = vporq_avx512f(auVar39,auVar36);
          uVar10 = vpcmpuq_avx512f(auVar39,auVar38,2);
          bVar13 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar37,auVar38,2);
          bVar14 = (byte)uVar10;
          uVar32 = CONCAT11(bVar14,bVar13);
          auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar18));
          auVar44._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar37._4_4_;
          auVar44._0_4_ = (uint)(bVar13 & 1) * auVar37._0_4_;
          auVar44._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar37._8_4_;
          auVar44._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar37._12_4_;
          auVar44._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar37._16_4_;
          auVar44._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar37._20_4_;
          auVar44._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar37._24_4_;
          auVar44._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar37._28_4_;
          auVar44._32_4_ = (uint)(bVar14 & 1) * auVar37._32_4_;
          auVar44._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar37._36_4_;
          auVar44._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar37._40_4_;
          auVar44._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar37._44_4_;
          auVar44._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar37._48_4_;
          auVar44._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar37._52_4_;
          auVar44._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar37._56_4_;
          auVar44._60_4_ = (uint)(bVar14 >> 7) * auVar37._60_4_;
          uVar18 = uVar18 + 0x10;
          auVar37 = vpmulld_avx512f(auVar44,auVar40);
        } while ((uVar25 + 0xf & 0x1fffffff0) != uVar18);
        auVar36 = vmovdqa32_avx512f(auVar37);
        auVar35._0_4_ =
             (uint)(bVar13 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar40._0_4_;
        bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar7 * auVar36._4_4_ | (uint)!bVar7 * auVar40._4_4_;
        bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar7 * auVar36._8_4_ | (uint)!bVar7 * auVar40._8_4_;
        bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar7 * auVar36._12_4_ | (uint)!bVar7 * auVar40._12_4_;
        bVar7 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar7 * auVar36._16_4_ | (uint)!bVar7 * auVar40._16_4_;
        bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar7 * auVar36._20_4_ | (uint)!bVar7 * auVar40._20_4_;
        bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar7 * auVar36._24_4_ | (uint)!bVar7 * auVar40._24_4_;
        bVar7 = (bool)((byte)(uVar32 >> 7) & 1);
        auVar35._28_4_ = (uint)bVar7 * auVar36._28_4_ | (uint)!bVar7 * auVar40._28_4_;
        auVar35._32_4_ =
             (uint)(bVar14 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar40._32_4_;
        bVar7 = (bool)(bVar14 >> 1 & 1);
        auVar35._36_4_ = (uint)bVar7 * auVar36._36_4_ | (uint)!bVar7 * auVar40._36_4_;
        bVar7 = (bool)(bVar14 >> 2 & 1);
        auVar35._40_4_ = (uint)bVar7 * auVar36._40_4_ | (uint)!bVar7 * auVar40._40_4_;
        bVar7 = (bool)(bVar14 >> 3 & 1);
        auVar35._44_4_ = (uint)bVar7 * auVar36._44_4_ | (uint)!bVar7 * auVar40._44_4_;
        bVar7 = (bool)(bVar14 >> 4 & 1);
        auVar35._48_4_ = (uint)bVar7 * auVar36._48_4_ | (uint)!bVar7 * auVar40._48_4_;
        bVar7 = (bool)(bVar14 >> 5 & 1);
        auVar35._52_4_ = (uint)bVar7 * auVar36._52_4_ | (uint)!bVar7 * auVar40._52_4_;
        bVar7 = (bool)(bVar14 >> 6 & 1);
        auVar35._56_4_ = (uint)bVar7 * auVar36._56_4_ | (uint)!bVar7 * auVar40._56_4_;
        auVar35._60_4_ =
             (uint)(bVar14 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar40._60_4_;
        auVar34 = vextracti64x4_avx512f(auVar35,1);
        auVar36 = vpmulld_avx512f(auVar35,ZEXT3264(auVar34));
        auVar60 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
        auVar9 = vpshufd_avx(auVar60,0xee);
        auVar60 = vpmulld_avx(auVar60,auVar9);
        auVar9 = vpshufd_avx(auVar60,0x55);
        auVar60 = vpmulld_avx(auVar60,auVar9);
        iVar15 = auVar60._0_4_;
      }
      uVar21 = iVar15 * (this_00->values).d.bd;
      uVar25 = (ulong)uVar21;
      pfVar5 = (this_00->values).v;
      local_98[0] = (float)local_b8 * (local_c8->super_Trainer).eta * auVar33._0_4_ * -0.5 *
                    auVar57._0_4_;
      uStack_8c = SUB84(pfVar16,0);
      uStack_88 = (undefined4)((ulong)pfVar16 >> 0x20);
      if (uVar21 != uVar29) {
LAB_0022c0c6:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
                     );
      }
      uVar18 = uVar25;
      if ((((ulong)pfVar5 & 3) == 0) &&
         (uVar18 = (ulong)(-((uint)((ulong)pfVar5 >> 2) & 0x3fffffff) & 0xf), uVar25 <= uVar18)) {
        uVar18 = uVar25;
      }
      uVar26 = uVar25 - uVar18;
      uVar24 = uVar26 + 0xf;
      if (-1 < (long)uVar26) {
        uVar24 = uVar26;
      }
      if (uVar18 != 0) {
        auVar9._8_4_ = 0x80000000;
        auVar9._0_8_ = 0x8000000080000000;
        auVar9._12_4_ = 0x80000000;
        auVar33 = vxorps_avx512vl(ZEXT416((uint)local_98[0]),auVar9);
        uVar27 = 0;
        do {
          auVar57 = vfmsub231ss_fma(ZEXT416((uint)(auVar55._0_4_ * pfVar4[uVar27])),auVar33,
                                    ZEXT416((uint)pfVar16[uVar27]));
          pfVar5[uVar27] = auVar57._0_4_ + pfVar5[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar18 != uVar27);
      }
      uVar24 = (uVar24 & 0xfffffffffffffff0) + uVar18;
      if (0xf < (long)uVar26) {
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar33 = vxorps_avx512vl(auVar55,auVar11);
        auVar36 = vbroadcastss_avx512f(ZEXT416((uint)local_98[0]));
        auVar35 = vbroadcastss_avx512f(auVar33);
        do {
          auVar37 = vmulps_avx512f(auVar36,*(undefined1 (*) [64])(pfVar16 + uVar18));
          auVar37 = vfmsub231ps_avx512f(auVar37,auVar35,*(undefined1 (*) [64])(pfVar4 + uVar18));
          auVar37 = vaddps_avx512f(auVar37,*(undefined1 (*) [64])(pfVar5 + uVar18));
          *(undefined1 (*) [64])(pfVar5 + uVar18) = auVar37;
          uVar18 = uVar18 + 0x10;
        } while ((long)uVar18 < (long)uVar24);
      }
      if ((long)uVar24 < (long)uVar25) {
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar33 = vxorps_avx512vl(ZEXT416((uint)local_98[0]),auVar12);
        do {
          auVar57 = vfmsub231ss_fma(ZEXT416((uint)(auVar55._0_4_ * pfVar4[uVar24])),auVar33,
                                    ZEXT416((uint)pfVar16[uVar24]));
          pfVar5[uVar24] = auVar57._0_4_ + pfVar5[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar25 != uVar24);
      }
      local_c0 = (LookupParameters *)(ulong)((int)local_c0 + 1);
      Parameters::clear(this_00);
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      ppPVar19 = (pointer)(local_68._0_8_ + 8);
    } while (ppPVar19 != local_a0);
    pMVar17 = (local_c8->super_Trainer).model;
  }
  ppLVar20 = (pMVar17->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar1 = (pMVar17->lookup_params).
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar20 != ppLVar1) {
    auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    local_b8 = 0;
    local_a0 = (pointer)CONCAT44(local_a0._4_4_,local_a8._0_4_ * local_b0._0_4_);
    local_a8 = ppLVar1;
    do {
      this_01 = *ppLVar20;
      p_Var30 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      local_b0 = ppLVar20;
      if (p_Var30 != (_Hash_node_base *)0x0) {
        local_78._0_8_ = (local_b8 & 0xffffffff) * 0x18 + *(long *)&local_c8->hlg;
        pRVar28 = local_c8;
        local_c0 = this_01;
        do {
          uVar25 = (ulong)*(uint *)&p_Var30[1]._M_nxt;
          pTVar6 = (local_c0->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar15 = 1;
          iVar53 = 1;
          uVar18 = (ulong)pTVar6[uVar25].d.nd;
          if (uVar18 != 0) {
            auVar38 = vmovdqa64_avx512f(auVar37);
            auVar39 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar40 = vpbroadcastq_avx512f();
              auVar45 = vmovdqa64_avx512f(auVar38);
              auVar38 = vporq_avx512f(auVar40,auVar35);
              auVar40 = vporq_avx512f(auVar40,auVar36);
              uVar10 = vpcmpuq_avx512f(auVar40,auVar39,2);
              bVar13 = (byte)uVar10;
              uVar10 = vpcmpuq_avx512f(auVar38,auVar39,2);
              bVar14 = (byte)uVar10;
              uVar32 = CONCAT11(bVar14,bVar13);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar6[uVar25].d.d + uVar24));
              auVar40._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
              auVar40._0_4_ = (uint)(bVar13 & 1) * auVar38._0_4_;
              auVar40._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
              auVar40._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
              auVar40._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
              auVar40._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
              auVar40._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
              auVar40._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
              auVar40._32_4_ = (uint)(bVar14 & 1) * auVar38._32_4_;
              auVar40._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar38._36_4_;
              auVar40._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar38._40_4_;
              auVar40._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar38._44_4_;
              auVar40._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar38._48_4_;
              auVar40._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar38._52_4_;
              auVar40._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar38._56_4_;
              auVar40._60_4_ = (uint)(bVar14 >> 7) * auVar38._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar38 = vpmulld_avx512f(auVar40,auVar45);
            } while ((uVar18 + 0xf & 0x1fffffff0) != uVar24);
            auVar38 = vmovdqa32_avx512f(auVar38);
            auVar46._0_4_ =
                 (uint)(bVar13 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar45._0_4_;
            bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar45._4_4_;
            bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * auVar45._8_4_;
            bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar46._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * auVar45._12_4_;
            bVar7 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar46._16_4_ = (uint)bVar7 * auVar38._16_4_ | (uint)!bVar7 * auVar45._16_4_;
            bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar46._20_4_ = (uint)bVar7 * auVar38._20_4_ | (uint)!bVar7 * auVar45._20_4_;
            bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar46._24_4_ = (uint)bVar7 * auVar38._24_4_ | (uint)!bVar7 * auVar45._24_4_;
            bVar7 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar46._28_4_ = (uint)bVar7 * auVar38._28_4_ | (uint)!bVar7 * auVar45._28_4_;
            auVar46._32_4_ =
                 (uint)(bVar14 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar45._32_4_;
            bVar7 = (bool)(bVar14 >> 1 & 1);
            auVar46._36_4_ = (uint)bVar7 * auVar38._36_4_ | (uint)!bVar7 * auVar45._36_4_;
            bVar7 = (bool)(bVar14 >> 2 & 1);
            auVar46._40_4_ = (uint)bVar7 * auVar38._40_4_ | (uint)!bVar7 * auVar45._40_4_;
            bVar7 = (bool)(bVar14 >> 3 & 1);
            auVar46._44_4_ = (uint)bVar7 * auVar38._44_4_ | (uint)!bVar7 * auVar45._44_4_;
            bVar7 = (bool)(bVar14 >> 4 & 1);
            auVar46._48_4_ = (uint)bVar7 * auVar38._48_4_ | (uint)!bVar7 * auVar45._48_4_;
            bVar7 = (bool)(bVar14 >> 5 & 1);
            auVar46._52_4_ = (uint)bVar7 * auVar38._52_4_ | (uint)!bVar7 * auVar45._52_4_;
            bVar7 = (bool)(bVar14 >> 6 & 1);
            auVar46._56_4_ = (uint)bVar7 * auVar38._56_4_ | (uint)!bVar7 * auVar45._56_4_;
            auVar46._60_4_ =
                 (uint)(bVar14 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar45._60_4_;
            auVar34 = vextracti64x4_avx512f(auVar46,1);
            auVar38 = vpmulld_avx512f(auVar46,ZEXT3264(auVar34));
            auVar55 = vpmulld_avx(auVar38._0_16_,auVar38._16_16_);
            auVar33 = vpshufd_avx(auVar55,0xee);
            auVar55 = vpmulld_avx(auVar55,auVar33);
            auVar33 = vpshufd_avx(auVar55,0x55);
            auVar55 = vpmulld_avx(auVar55,auVar33);
            iVar53 = auVar55._0_4_;
          }
          pTVar22 = (local_c0->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar18 = (ulong)pTVar22[uVar25].d.nd;
          if (uVar18 != 0) {
            auVar38 = vmovdqa64_avx512f(auVar37);
            auVar39 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar40 = vpbroadcastq_avx512f();
              auVar45 = vmovdqa64_avx512f(auVar38);
              auVar38 = vporq_avx512f(auVar40,auVar35);
              auVar40 = vporq_avx512f(auVar40,auVar36);
              uVar10 = vpcmpuq_avx512f(auVar40,auVar39,2);
              bVar13 = (byte)uVar10;
              uVar10 = vpcmpuq_avx512f(auVar38,auVar39,2);
              bVar14 = (byte)uVar10;
              uVar32 = CONCAT11(bVar14,bVar13);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar22[uVar25].d.d + uVar24));
              auVar47._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
              auVar47._0_4_ = (uint)(bVar13 & 1) * auVar38._0_4_;
              auVar47._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
              auVar47._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
              auVar47._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
              auVar47._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
              auVar47._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
              auVar47._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
              auVar47._32_4_ = (uint)(bVar14 & 1) * auVar38._32_4_;
              auVar47._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar38._36_4_;
              auVar47._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar38._40_4_;
              auVar47._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar38._44_4_;
              auVar47._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar38._48_4_;
              auVar47._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar38._52_4_;
              auVar47._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar38._56_4_;
              auVar47._60_4_ = (uint)(bVar14 >> 7) * auVar38._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar38 = vpmulld_avx512f(auVar47,auVar45);
            } while ((uVar18 + 0xf & 0x1fffffff0) != uVar24);
            auVar38 = vmovdqa32_avx512f(auVar38);
            auVar48._0_4_ =
                 (uint)(bVar13 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar45._0_4_;
            bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar45._4_4_;
            bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * auVar45._8_4_;
            bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar48._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * auVar45._12_4_;
            bVar7 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar48._16_4_ = (uint)bVar7 * auVar38._16_4_ | (uint)!bVar7 * auVar45._16_4_;
            bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar48._20_4_ = (uint)bVar7 * auVar38._20_4_ | (uint)!bVar7 * auVar45._20_4_;
            bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar48._24_4_ = (uint)bVar7 * auVar38._24_4_ | (uint)!bVar7 * auVar45._24_4_;
            bVar7 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar48._28_4_ = (uint)bVar7 * auVar38._28_4_ | (uint)!bVar7 * auVar45._28_4_;
            auVar48._32_4_ =
                 (uint)(bVar14 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar45._32_4_;
            bVar7 = (bool)(bVar14 >> 1 & 1);
            auVar48._36_4_ = (uint)bVar7 * auVar38._36_4_ | (uint)!bVar7 * auVar45._36_4_;
            bVar7 = (bool)(bVar14 >> 2 & 1);
            auVar48._40_4_ = (uint)bVar7 * auVar38._40_4_ | (uint)!bVar7 * auVar45._40_4_;
            bVar7 = (bool)(bVar14 >> 3 & 1);
            auVar48._44_4_ = (uint)bVar7 * auVar38._44_4_ | (uint)!bVar7 * auVar45._44_4_;
            bVar7 = (bool)(bVar14 >> 4 & 1);
            auVar48._48_4_ = (uint)bVar7 * auVar38._48_4_ | (uint)!bVar7 * auVar45._48_4_;
            bVar7 = (bool)(bVar14 >> 5 & 1);
            auVar48._52_4_ = (uint)bVar7 * auVar38._52_4_ | (uint)!bVar7 * auVar45._52_4_;
            bVar7 = (bool)(bVar14 >> 6 & 1);
            auVar48._56_4_ = (uint)bVar7 * auVar38._56_4_ | (uint)!bVar7 * auVar45._56_4_;
            auVar48._60_4_ =
                 (uint)(bVar14 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar45._60_4_;
            auVar34 = vextracti64x4_avx512f(auVar48,1);
            auVar38 = vpmulld_avx512f(auVar48,ZEXT3264(auVar34));
            auVar55 = vpmulld_avx(auVar38._0_16_,auVar38._16_16_);
            auVar33 = vpshufd_avx(auVar55,0xee);
            auVar55 = vpmulld_avx(auVar55,auVar33);
            auVar33 = vpshufd_avx(auVar55,0x55);
            auVar55 = vpmulld_avx(auVar55,auVar33);
            iVar15 = auVar55._0_4_;
          }
          rVar63 = (pRVar28->super_Trainer).lambda;
          uVar64 = 0;
          uVar21 = 0;
          uVar29 = 0;
          uVar31 = iVar53 * pTVar6[uVar25].d.bd;
          uVar23 = iVar15 * pTVar22[uVar25].d.bd;
          local_48 = (ulong)uVar23;
          pfVar4 = pTVar6[uVar25].v;
          local_50 = pTVar22[uVar25].v;
          lVar2 = *(long *)local_78._0_8_;
          if (uVar23 == 0) {
            auVar55 = ZEXT816(0) << 0x40;
          }
          else {
            local_90 = SUB84(local_50,0);
            uStack_8c = (undefined4)((ulong)local_50 >> 0x20);
            local_68 = ZEXT416((uint)rVar63);
            local_80.m_value = local_48;
            SVar54 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                 *)local_98,&local_c9,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                 *)&local_50);
            auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar55._0_8_ = (double)SVar54;
            auVar55._8_8_ = extraout_XMM0_Qb_00;
            pTVar22 = (local_c0->grads).
                      super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pRVar28 = local_c8;
            rVar63 = (real)local_68._0_4_;
            uVar64 = local_68._4_4_;
            uVar21 = local_68._8_4_;
            uVar29 = local_68._12_4_;
          }
          auVar61._0_8_ = (double)(pRVar28->rho * *(float *)(lVar2 + uVar25 * 4));
          auVar61._8_8_ = 0;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = 1.0 - (double)pRVar28->rho;
          auVar55 = vfmadd213sd_fma(auVar58,auVar55,auVar61);
          *(float *)(lVar2 + uVar25 * 4) = (float)auVar55._0_8_;
          fVar8 = (float)auVar55._0_8_ + pRVar28->epsilon;
          pfVar16 = pTVar22[uVar25].v;
          uVar18 = (ulong)pTVar22[uVar25].d.nd;
          auVar55 = vrsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
          auVar33 = vfmadd213ss_fma(ZEXT416((uint)(fVar8 * auVar55._0_4_)),auVar55,
                                    ZEXT416(0xc0400000));
          if (uVar18 == 0) {
            iVar15 = 1;
          }
          else {
            auVar38 = vmovdqa64_avx512f(auVar37);
            auVar39 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar40 = vpbroadcastq_avx512f();
              auVar45 = vmovdqa64_avx512f(auVar38);
              auVar38 = vporq_avx512f(auVar40,auVar35);
              auVar40 = vporq_avx512f(auVar40,auVar36);
              uVar10 = vpcmpuq_avx512f(auVar40,auVar39,2);
              bVar13 = (byte)uVar10;
              uVar10 = vpcmpuq_avx512f(auVar38,auVar39,2);
              bVar14 = (byte)uVar10;
              uVar32 = CONCAT11(bVar14,bVar13);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar22[uVar25].d.d + uVar24));
              auVar49._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
              auVar49._0_4_ = (uint)(bVar13 & 1) * auVar38._0_4_;
              auVar49._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
              auVar49._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
              auVar49._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
              auVar49._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
              auVar49._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
              auVar49._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
              auVar49._32_4_ = (uint)(bVar14 & 1) * auVar38._32_4_;
              auVar49._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar38._36_4_;
              auVar49._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar38._40_4_;
              auVar49._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar38._44_4_;
              auVar49._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar38._48_4_;
              auVar49._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar38._52_4_;
              auVar49._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar38._56_4_;
              auVar49._60_4_ = (uint)(bVar14 >> 7) * auVar38._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar38 = vpmulld_avx512f(auVar49,auVar45);
            } while ((uVar18 + 0xf & 0x1fffffff0) != uVar24);
            auVar38 = vmovdqa32_avx512f(auVar38);
            auVar50._0_4_ =
                 (uint)(bVar13 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar45._0_4_;
            bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar45._4_4_;
            bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * auVar45._8_4_;
            bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar50._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * auVar45._12_4_;
            bVar7 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar50._16_4_ = (uint)bVar7 * auVar38._16_4_ | (uint)!bVar7 * auVar45._16_4_;
            bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar50._20_4_ = (uint)bVar7 * auVar38._20_4_ | (uint)!bVar7 * auVar45._20_4_;
            bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar50._24_4_ = (uint)bVar7 * auVar38._24_4_ | (uint)!bVar7 * auVar45._24_4_;
            bVar7 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar50._28_4_ = (uint)bVar7 * auVar38._28_4_ | (uint)!bVar7 * auVar45._28_4_;
            auVar50._32_4_ =
                 (uint)(bVar14 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar45._32_4_;
            bVar7 = (bool)(bVar14 >> 1 & 1);
            auVar50._36_4_ = (uint)bVar7 * auVar38._36_4_ | (uint)!bVar7 * auVar45._36_4_;
            bVar7 = (bool)(bVar14 >> 2 & 1);
            auVar50._40_4_ = (uint)bVar7 * auVar38._40_4_ | (uint)!bVar7 * auVar45._40_4_;
            bVar7 = (bool)(bVar14 >> 3 & 1);
            auVar50._44_4_ = (uint)bVar7 * auVar38._44_4_ | (uint)!bVar7 * auVar45._44_4_;
            bVar7 = (bool)(bVar14 >> 4 & 1);
            auVar50._48_4_ = (uint)bVar7 * auVar38._48_4_ | (uint)!bVar7 * auVar45._48_4_;
            bVar7 = (bool)(bVar14 >> 5 & 1);
            auVar50._52_4_ = (uint)bVar7 * auVar38._52_4_ | (uint)!bVar7 * auVar45._52_4_;
            bVar7 = (bool)(bVar14 >> 6 & 1);
            auVar50._56_4_ = (uint)bVar7 * auVar38._56_4_ | (uint)!bVar7 * auVar45._56_4_;
            auVar50._60_4_ =
                 (uint)(bVar14 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar45._60_4_;
            auVar34 = vextracti64x4_avx512f(auVar50,1);
            auVar38 = vpmulld_avx512f(auVar50,ZEXT3264(auVar34));
            auVar57 = vpmulld_avx(auVar38._0_16_,auVar38._16_16_);
            auVar60 = vpshufd_avx(auVar57,0xee);
            auVar57 = vpmulld_avx(auVar57,auVar60);
            auVar60 = vpshufd_avx(auVar57,0x55);
            auVar57 = vpmulld_avx(auVar57,auVar60);
            iVar15 = auVar57._0_4_;
          }
          if (iVar15 * pTVar22[uVar25].d.bd != uVar31) goto LAB_0022c0e8;
          pTVar6 = (local_c0->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar18 = (ulong)pTVar6[uVar25].d.nd;
          if (uVar18 == 0) {
            iVar15 = 1;
          }
          else {
            auVar38 = vmovdqa64_avx512f(auVar37);
            auVar39 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar40 = vpbroadcastq_avx512f();
              auVar45 = vmovdqa64_avx512f(auVar38);
              auVar38 = vporq_avx512f(auVar40,auVar35);
              auVar40 = vporq_avx512f(auVar40,auVar36);
              uVar10 = vpcmpuq_avx512f(auVar40,auVar39,2);
              bVar13 = (byte)uVar10;
              uVar10 = vpcmpuq_avx512f(auVar38,auVar39,2);
              bVar14 = (byte)uVar10;
              uVar32 = CONCAT11(bVar14,bVar13);
              auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar6[uVar25].d.d + uVar24));
              auVar51._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
              auVar51._0_4_ = (uint)(bVar13 & 1) * auVar38._0_4_;
              auVar51._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
              auVar51._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
              auVar51._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
              auVar51._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
              auVar51._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
              auVar51._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
              auVar51._32_4_ = (uint)(bVar14 & 1) * auVar38._32_4_;
              auVar51._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar38._36_4_;
              auVar51._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar38._40_4_;
              auVar51._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar38._44_4_;
              auVar51._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar38._48_4_;
              auVar51._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar38._52_4_;
              auVar51._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar38._56_4_;
              auVar51._60_4_ = (uint)(bVar14 >> 7) * auVar38._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar38 = vpmulld_avx512f(auVar51,auVar45);
            } while ((uVar18 + 0xf & 0x1fffffff0) != uVar24);
            auVar38 = vmovdqa32_avx512f(auVar38);
            auVar52._0_4_ =
                 (uint)(bVar13 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar45._0_4_;
            bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar45._4_4_;
            bVar7 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * auVar45._8_4_;
            bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar52._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * auVar45._12_4_;
            bVar7 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar52._16_4_ = (uint)bVar7 * auVar38._16_4_ | (uint)!bVar7 * auVar45._16_4_;
            bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar52._20_4_ = (uint)bVar7 * auVar38._20_4_ | (uint)!bVar7 * auVar45._20_4_;
            bVar7 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar52._24_4_ = (uint)bVar7 * auVar38._24_4_ | (uint)!bVar7 * auVar45._24_4_;
            bVar7 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar52._28_4_ = (uint)bVar7 * auVar38._28_4_ | (uint)!bVar7 * auVar45._28_4_;
            auVar52._32_4_ =
                 (uint)(bVar14 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar45._32_4_;
            bVar7 = (bool)(bVar14 >> 1 & 1);
            auVar52._36_4_ = (uint)bVar7 * auVar38._36_4_ | (uint)!bVar7 * auVar45._36_4_;
            bVar7 = (bool)(bVar14 >> 2 & 1);
            auVar52._40_4_ = (uint)bVar7 * auVar38._40_4_ | (uint)!bVar7 * auVar45._40_4_;
            bVar7 = (bool)(bVar14 >> 3 & 1);
            auVar52._44_4_ = (uint)bVar7 * auVar38._44_4_ | (uint)!bVar7 * auVar45._44_4_;
            bVar7 = (bool)(bVar14 >> 4 & 1);
            auVar52._48_4_ = (uint)bVar7 * auVar38._48_4_ | (uint)!bVar7 * auVar45._48_4_;
            bVar7 = (bool)(bVar14 >> 5 & 1);
            auVar52._52_4_ = (uint)bVar7 * auVar38._52_4_ | (uint)!bVar7 * auVar45._52_4_;
            bVar7 = (bool)(bVar14 >> 6 & 1);
            auVar52._56_4_ = (uint)bVar7 * auVar38._56_4_ | (uint)!bVar7 * auVar45._56_4_;
            auVar52._60_4_ =
                 (uint)(bVar14 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar45._60_4_;
            auVar34 = vextracti64x4_avx512f(auVar52,1);
            auVar38 = vpmulld_avx512f(auVar52,ZEXT3264(auVar34));
            auVar57 = vpmulld_avx(auVar38._0_16_,auVar38._16_16_);
            auVar60 = vpshufd_avx(auVar57,0xee);
            auVar57 = vpmulld_avx(auVar57,auVar60);
            auVar60 = vpshufd_avx(auVar57,0x55);
            auVar57 = vpmulld_avx(auVar57,auVar60);
            iVar15 = auVar57._0_4_;
          }
          uVar23 = iVar15 * pTVar6[uVar25].d.bd;
          uVar18 = (ulong)uVar23;
          pfVar5 = pTVar6[uVar25].v;
          local_98[0] = local_a0._0_4_ * (pRVar28->super_Trainer).eta * auVar55._0_4_ * -0.5 *
                        auVar33._0_4_;
          uStack_8c = SUB84(pfVar16,0);
          uStack_88 = (undefined4)((ulong)pfVar16 >> 0x20);
          if (uVar23 != uVar31) goto LAB_0022c0c6;
          uVar25 = uVar18;
          if ((((ulong)pfVar5 & 3) == 0) &&
             (uVar25 = (ulong)(-((uint)((ulong)pfVar5 >> 2) & 0x3fffffff) & 0xf), uVar18 <= uVar25))
          {
            uVar25 = uVar18;
          }
          uVar26 = uVar18 - uVar25;
          uVar24 = uVar26 + 0xf;
          if (-1 < (long)uVar26) {
            uVar24 = uVar26;
          }
          if (uVar25 != 0) {
            auVar59._0_4_ = -local_98[0];
            auVar59._4_4_ = 0x80000000;
            auVar59._8_4_ = 0x80000000;
            auVar59._12_4_ = 0x80000000;
            uVar27 = 0;
            do {
              auVar55 = vfmsub231ss_fma(ZEXT416((uint)(rVar63 * pfVar4[uVar27])),auVar59,
                                        ZEXT416((uint)pfVar16[uVar27]));
              pfVar5[uVar27] = auVar55._0_4_ + pfVar5[uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar25 != uVar27);
          }
          uVar24 = (uVar24 & 0xfffffffffffffff0) + uVar25;
          if (0xf < (long)uVar26) {
            auVar38 = vbroadcastss_avx512f(ZEXT416((uint)local_98[0]));
            auVar62._0_8_ = CONCAT44(uVar64,rVar63) ^ 0x8000000080000000;
            auVar62._8_4_ = uVar21 ^ 0x80000000;
            auVar62._12_4_ = uVar29 ^ 0x80000000;
            auVar39 = vbroadcastss_avx512f(auVar62);
            do {
              auVar40 = vmulps_avx512f(auVar38,*(undefined1 (*) [64])(pfVar16 + uVar25));
              auVar40 = vfmsub231ps_avx512f(auVar40,auVar39,*(undefined1 (*) [64])(pfVar4 + uVar25))
              ;
              auVar40 = vaddps_avx512f(auVar40,*(undefined1 (*) [64])(pfVar5 + uVar25));
              *(undefined1 (*) [64])(pfVar5 + uVar25) = auVar40;
              uVar25 = uVar25 + 0x10;
            } while ((long)uVar25 < (long)uVar24);
          }
          if ((long)uVar24 < (long)uVar18) {
            auVar56._0_4_ = -local_98[0];
            auVar56._4_4_ = 0x80000000;
            auVar56._8_4_ = 0x80000000;
            auVar56._12_4_ = 0x80000000;
            do {
              auVar55 = vfmsub231ss_fma(ZEXT416((uint)(rVar63 * pfVar4[uVar24])),auVar56,
                                        ZEXT416((uint)pfVar16[uVar24]));
              pfVar5[uVar24] = auVar55._0_4_ + pfVar5[uVar24];
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
          }
          p_Var30 = p_Var30->_M_nxt;
          this_01 = local_c0;
        } while (p_Var30 != (_Hash_node_base *)0x0);
      }
      local_b8 = (ulong)((int)local_b8 + 1);
      LookupParameters::clear(this_01);
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
      ppLVar20 = local_b0 + 1;
    } while (ppLVar20 != local_a8);
  }
  (local_c8->super_Trainer).updates = (local_c8->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void RmsPropTrainer::update(real scale) {
  unsigned pi = 0;
  if (!shadow_params_allocated) {
    hg.resize(model->parameters_list().size());

    pi = 0;
    hlg.resize(model->lookup_parameters_list().size());
    for (auto p : model->lookup_parameters_list()) {
      hlg[pi++].resize(p->size());
    }

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    real& d2 = hg[pi++];
    auto reg = p->values.vec() * lambda;
    real g2 = p->g.vec().squaredNorm();
    d2 = rho * d2 + (1.0 - rho) * g2;
    p->values.vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->g.vec() + reg);
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<real>& hlgx = hlg[pi++];
    for (auto i : p->non_zero_grads) {
      real& d2 = hlgx[i];
      auto reg = p->values[i].vec() * lambda;
      real g2 = p->grads[i].vec().squaredNorm();
      d2 = rho * d2 + (1.0 - rho) * g2;
      p->values[i].vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->grads[i].vec() + reg);
    }
    p->clear();
  }
  ++updates;
}